

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall CGL::HDRImageBuffer::HDRImageBuffer(HDRImageBuffer *this,size_t w,size_t h)

{
  size_type in_RDX;
  vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::vector
            ((vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *)0x155997);
  std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::resize(in_RSI,in_RDX);
  return;
}

Assistant:

HDRImageBuffer(size_t w, size_t h) : w(w), h(h) { data.resize(w * h); }